

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QStyleSheetPaletteData>::reset
          (QSharedDataPointer<QStyleSheetPaletteData> *this,QStyleSheetPaletteData *ptr)

{
  QStyleSheetPaletteData *pQVar1;
  
  if ((this->d).ptr != ptr) {
    if (ptr != (QStyleSheetPaletteData *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar1 = (this->d).ptr;
    (this->d).ptr = ptr;
    if (pQVar1 != (QStyleSheetPaletteData *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> == 0) {
        QBrush::~QBrush(&pQVar1->accent);
        QBrush::~QBrush(&pQVar1->placeholderForeground);
        QBrush::~QBrush(&pQVar1->alternateBackground);
        QBrush::~QBrush(&pQVar1->selectionBackground);
        QBrush::~QBrush(&pQVar1->selectionForeground);
        QBrush::~QBrush(&pQVar1->foreground);
        operator_delete(pQVar1,0x38);
        return;
      }
    }
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }